

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall Tjen::Node::editStack(Node *this,string *newTop)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  value_type *pvVar4;
  value_type local_1d;
  int local_1c;
  char t;
  string *psStack_18;
  int i;
  string *newTop_local;
  Node *this_local;
  
  psStack_18 = newTop;
  newTop_local = &this->name;
  bVar1 = std::operator==(newTop,anon_var_dwarf_e64d7);
  if (bVar1) {
    std::stack<char,_std::deque<char,_std::allocator<char>_>_>::pop(&this->stack);
  }
  else {
    uVar2 = std::__cxx11::string::size();
    if (1 < uVar2) {
      for (local_1c = 0; uVar2 = (ulong)local_1c, lVar3 = std::__cxx11::string::size(),
          uVar2 < lVar3 - 1U; local_1c = local_1c + 1) {
        pvVar4 = (value_type *)std::__cxx11::string::operator[]((ulong)psStack_18);
        local_1d = *pvVar4;
        std::stack<char,_std::deque<char,_std::allocator<char>_>_>::push(&this->stack,&local_1d);
      }
    }
  }
  return;
}

Assistant:

void Tjen::Node::editStack( const std::string &newTop) {
    if(newTop == "ε"){
        stack.pop();

    }else if(newTop.size() >= 2){
        for (int i = 0; i < newTop.size()-1; ++i) {
            char t = newTop[0];
            stack.push(t);
        }

    }
}